

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void google::protobuf::internal::VerifyVersion
               (int headerVersion,int minLibraryVersion,char *filename)

{
  LogMessage *pLVar1;
  int version;
  int version_00;
  int version_01;
  int version_02;
  LogFinisher local_121;
  string local_120;
  string local_100;
  LogMessage local_e0;
  LogFinisher local_a1;
  string local_a0;
  string local_80;
  LogMessage local_50;
  char *local_18;
  char *filename_local;
  int minLibraryVersion_local;
  int headerVersion_local;
  
  local_18 = filename;
  filename_local._0_4_ = minLibraryVersion;
  filename_local._4_4_ = headerVersion;
  if (0x1e9809 < minLibraryVersion) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/stubs/common.cc"
               ,0x3d);
    pLVar1 = LogMessage::operator<<(&local_50,"This program requires version ");
    VersionString_abi_cxx11_(&local_80,(internal *)(ulong)(uint)filename_local,version);
    pLVar1 = LogMessage::operator<<(pLVar1,&local_80);
    pLVar1 = LogMessage::operator<<
                       (pLVar1,
                        " of the Protocol Buffer runtime library, but the installed version is ");
    VersionString_abi_cxx11_(&local_a0,(internal *)0x1e9809,version_00);
    pLVar1 = LogMessage::operator<<(pLVar1,&local_a0);
    pLVar1 = LogMessage::operator<<
                       (pLVar1,
                        ".  Please update your library.  If you compiled the program yourself, make sure that your headers are from the same version of Protocol Buffers as your link-time library.  (Version verification failed in \""
                       );
    pLVar1 = LogMessage::operator<<(pLVar1,local_18);
    pLVar1 = LogMessage::operator<<(pLVar1,"\".)");
    LogFinisher::operator=(&local_a1,pLVar1);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    LogMessage::~LogMessage(&local_50);
  }
  if ((int)filename_local._4_4_ < 0x1e9809) {
    LogMessage::LogMessage
              (&local_e0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/stubs/common.cc"
               ,0x48);
    pLVar1 = LogMessage::operator<<(&local_e0,"This program was compiled against version ");
    VersionString_abi_cxx11_(&local_100,(internal *)(ulong)filename_local._4_4_,version_01);
    pLVar1 = LogMessage::operator<<(pLVar1,&local_100);
    pLVar1 = LogMessage::operator<<
                       (pLVar1,
                        " of the Protocol Buffer runtime library, which is not compatible with the installed version ("
                       );
    VersionString_abi_cxx11_(&local_120,(internal *)0x1e9809,version_02);
    pLVar1 = LogMessage::operator<<(pLVar1,&local_120);
    pLVar1 = LogMessage::operator<<
                       (pLVar1,
                        ").  Contact the program author for an update.  If you compiled the program yourself, make sure that your headers are from the same version of Protocol Buffers as your link-time library.  (Version verification failed in \""
                       );
    pLVar1 = LogMessage::operator<<(pLVar1,local_18);
    pLVar1 = LogMessage::operator<<(pLVar1,"\".)");
    LogFinisher::operator=(&local_121,pLVar1);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    LogMessage::~LogMessage(&local_e0);
  }
  return;
}

Assistant:

void VerifyVersion(int headerVersion,
                   int minLibraryVersion,
                   const char* filename) {
  if (GOOGLE_PROTOBUF_VERSION < minLibraryVersion) {
    // Library is too old for headers.
    GOOGLE_LOG(FATAL)
      << "This program requires version " << VersionString(minLibraryVersion)
      << " of the Protocol Buffer runtime library, but the installed version "
         "is " << VersionString(GOOGLE_PROTOBUF_VERSION) << ".  Please update "
         "your library.  If you compiled the program yourself, make sure that "
         "your headers are from the same version of Protocol Buffers as your "
         "link-time library.  (Version verification failed in \""
      << filename << "\".)";
  }
  if (headerVersion < kMinHeaderVersionForLibrary) {
    // Headers are too old for library.
    GOOGLE_LOG(FATAL)
      << "This program was compiled against version "
      << VersionString(headerVersion) << " of the Protocol Buffer runtime "
         "library, which is not compatible with the installed version ("
      << VersionString(GOOGLE_PROTOBUF_VERSION) <<  ").  Contact the program "
         "author for an update.  If you compiled the program yourself, make "
         "sure that your headers are from the same version of Protocol Buffers "
         "as your link-time library.  (Version verification failed in \""
      << filename << "\".)";
  }
}